

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint32_t FNV1A_Pippip_Yurii(char *key,int wrdlen,uint32_t seed)

{
  ulong *puVar1;
  ulong uVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar4 = (ulong)seed ^ 0xcbf29ce484222325;
  if (wrdlen < 9) {
    bVar6 = (byte)(wrdlen << 3);
    sVar3 = (bVar6 < 0x41) * ('@' - bVar6);
    uVar4 = ((ulong)(*(long *)key << sVar3) >> sVar3 ^ uVar4) * 0x23462239;
  }
  else {
    uVar7 = wrdlen - 1U >> 4;
    uVar5 = (ulong)(uVar7 + 1);
    do {
      uVar2 = *(ulong *)key;
      puVar1 = (ulong *)((long)key + ((ulong)(uint)wrdlen - (ulong)(uVar7 * 8 + 8)));
      key = (char *)((long)key + 8);
      uVar4 = ((uVar4 ^ uVar2) * 0x23462239 ^ *puVar1) * 0x23462239;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  uVar7 = (uint)(uVar4 >> 0x20) ^ (uint)uVar4;
  return uVar7 >> 0x10 ^ uVar7;
}

Assistant:

uint32_t
FNV1A_Pippip_Yurii(const char *key, int wrdlen, uint32_t seed)
{
#define _PADr_KAZE(x, n) ( ((x) << (n))>>(n) )
  const char *str = (char *)key;
  const uint32_t PRIME = 591798841;
  uint32_t hash32;
  uint64_t hash64 = (uint64_t)seed ^ UINT64_C(14695981039346656037);
  size_t Cycles, NDhead;
  if (wrdlen > 8) {
    Cycles = ((wrdlen - 1) >> 4) + 1;
    NDhead = wrdlen - (Cycles << 3);
#pragma nounroll
    for (; Cycles--; str += 8) {
      hash64 = (hash64 ^ (*(uint64_t *)(str))) * PRIME;
      hash64 = (hash64 ^ (*(uint64_t *)(str + NDhead))) * PRIME;
    }
  } else {
    hash64 = (hash64 ^ _PADr_KAZE(*(uint64_t *)(str + 0), (8 - wrdlen) << 3)) *
             PRIME;
  }
  hash32 = (uint32_t)(hash64 ^ (hash64 >> 32));
  return hash32 ^ (hash32 >> 16);
#undef _PADr_KAZE
}